

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O3

void EDColor::InitColorEDLib(void)

{
  double *pdVar1;
  int i;
  long lVar2;
  double dVar3;
  
  if (!LUT_Initialized) {
    pdVar1 = LUT1;
    lVar2 = 0;
    do {
      dVar3 = (double)(int)lVar2 * 2.384185791015625e-07;
      if (0.04045 <= dVar3) {
        dVar3 = pow((dVar3 + 0.055) / 1.055,2.4);
      }
      else {
        dVar3 = dVar3 / 12.92;
      }
      *pdVar1 = dVar3;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 1;
    } while (lVar2 != 0x400001);
    pdVar1 = LUT2;
    lVar2 = 0;
    do {
      dVar3 = (double)(int)lVar2 * 2.384185791015625e-07;
      if (dVar3 <= 0.008856) {
        dVar3 = dVar3 * 7.787 + 0.13793103448275862;
      }
      else {
        dVar3 = pow(dVar3,0.3333333333333333);
      }
      *pdVar1 = dVar3;
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 1;
    } while (lVar2 != 0x400001);
    LUT_Initialized = true;
  }
  return;
}

Assistant:

void EDColor::InitColorEDLib()
{
	if (LUT_Initialized) 
		return;

	double inc = 1.0 / LUT_SIZE;
	for (int i = 0; i <= LUT_SIZE; i++) {
		double d = i * inc;

		if (d >= 0.04045) LUT1[i] = pow(((d + 0.055) / 1.055), 2.4);
		else              LUT1[i] = d / 12.92;
	} //end-for

	inc = 1.0 / LUT_SIZE;
	for (int i = 0; i <= LUT_SIZE; i++) {
		double d = i * inc;

		if (d > 0.008856) LUT2[i] = pow(d, 1.0 / 3.0);
		else              LUT2[i] = (7.787*d) + (16.0 / 116.0);
	} //end-for

	LUT_Initialized = true;
}